

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.hpp
# Opt level: O2

long duckdb::SubtractOperatorOverflowCheck::Operation<long,long,long>(long left,long right)

{
  bool bVar1;
  OutOfRangeException *this;
  allocator local_a9;
  long result;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  bVar1 = duckdb::TrySubtractOperator::Operation<long,long,long>(left,right,&result);
  if (bVar1) {
    return result;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_40,"Overflow in subtraction of %s (%s - %s)!",&local_a9);
  duckdb::TypeIdToString_abi_cxx11_((PhysicalType)&local_60);
  std::__cxx11::to_string(&local_80,left);
  std::__cxx11::to_string(&local_a0,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_40,&local_60,&local_80,&local_a0);
  __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TrySubtractOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in subtraction of %s (%s - %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}